

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall
ObjectTest_basic_assignment_operator_Test::TestBody(ObjectTest_basic_assignment_operator_Test *this)

{
  bool bVar1;
  char *pcVar2;
  longlong lhs;
  Message *this_00;
  AssertHelper local_928 [8];
  Message local_920 [8];
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_918;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_8f8;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_8d8;
  undefined1 local_8b8 [8];
  AssertionResult gtest_ar_14;
  AssertHelper local_888 [8];
  Message local_880 [15];
  bool local_871;
  undefined1 local_870 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_850 [8];
  Message local_848 [8];
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_840;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_820;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_800;
  undefined1 local_7e0 [8];
  AssertionResult gtest_ar_13;
  AssertHelper local_7b0 [8];
  Message local_7a8 [15];
  bool local_799;
  undefined1 local_798 [8];
  AssertionResult gtest_ar__13;
  Message local_780 [8];
  vector<jessilib::object,_std::allocator<jessilib::object>_> local_778;
  vector<jessilib::object,_std::allocator<jessilib::object>_> local_758;
  vector<jessilib::object,_std::allocator<jessilib::object>_> local_738;
  undefined1 local_720 [8];
  AssertionResult gtest_ar_12;
  AssertHelper local_6f0 [8];
  Message local_6e8 [15];
  bool local_6d9;
  undefined1 local_6d8 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_6b0 [8];
  Message local_6a8 [8];
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_6a0;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_680;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_660;
  undefined1 local_640 [8];
  AssertionResult gtest_ar_11;
  AssertHelper local_610 [8];
  Message local_608 [15];
  bool local_5f9;
  undefined1 local_5f8 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_5c8 [8];
  Message local_5c0 [8];
  longdouble local_5b8;
  longdouble local_5a8;
  undefined1 local_590 [8];
  AssertionResult gtest_ar_10;
  AssertHelper local_560 [8];
  Message local_558 [15];
  Message local_549;
  undefined1 local_548 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_528 [8];
  Message local_520 [8];
  double local_518;
  double local_510;
  undefined1 local_508 [8];
  AssertionResult gtest_ar_9;
  AssertHelper local_4d8 [8];
  Message local_4d0 [15];
  bool local_4c1;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_4a8 [8];
  Message local_4a0 [8];
  float local_498;
  float local_494;
  undefined1 local_490 [8];
  AssertionResult gtest_ar_8;
  AssertHelper local_460 [8];
  Message local_458 [15];
  bool local_449;
  undefined1 local_448 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_430 [8];
  Message local_428 [8];
  long local_420;
  long local_418;
  undefined1 local_410 [8];
  AssertionResult gtest_ar_7;
  AssertHelper local_3e0 [8];
  Message local_3d8 [15];
  bool local_3c9;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_3b0 [8];
  Message local_3a8 [8];
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_370 [8];
  Message local_368 [15];
  bool local_359;
  undefined1 local_358 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_340 [8];
  Message local_338 [8];
  long local_330;
  long local_328;
  undefined1 local_320 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_2f0 [8];
  Message local_2e8 [15];
  bool local_2d9;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_2c0 [8];
  Message local_2b8 [8];
  int local_2b0;
  int local_2ac;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_278 [8];
  Message local_270 [15];
  bool local_261;
  undefined1 local_260 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_248 [8];
  Message local_240 [12];
  short local_234;
  short local_232;
  undefined1 local_230 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_200 [8];
  Message local_1f8 [15];
  bool local_1e9;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_1d0 [8];
  Message local_1c8 [14];
  uchar local_1ba;
  uchar local_1b9;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_188 [8];
  Message local_180 [15];
  bool local_171;
  undefined1 local_170 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_158 [8];
  Message local_150 [14];
  char local_142;
  char local_141;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_110 [8];
  Message local_108 [15];
  bool local_f9;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_e0 [8];
  Message local_d8 [14];
  bool local_ca;
  bool local_c9;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_98 [8];
  Message local_90 [15];
  bool local_81;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_;
  bool local_59;
  undefined1 local_58 [8];
  object obj;
  ObjectTest_basic_assignment_operator_Test *this_local;
  
  jessilib::object::object((object *)local_58);
  local_59 = false;
  jessilib::object::operator=<bool,_nullptr>((object *)local_58,&local_59);
  local_81 = jessilib::object::has<bool>((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_80,&local_81,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar.message_,local_80,"obj .has< bool >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x28f,pcVar2);
    testing::internal::AssertHelper::operator=(local_98,local_90);
    testing::internal::AssertHelper::~AssertHelper(local_98);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_c9 = jessilib::object::get<bool,_nullptr>((object *)local_58,false);
  local_ca = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_c8,"obj .get< bool >()","bool {}",&local_c9,&local_ca);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              (local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x28f,pcVar2);
    testing::internal::AssertHelper::operator=(local_e0,local_d8);
    testing::internal::AssertHelper::~AssertHelper(local_e0);
    testing::Message::~Message(local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._7_1_ = 0;
  jessilib::object::operator=<signed_char,_nullptr>
            ((object *)local_58,
             (char *)((long)&gtest_ar__1.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 7));
  local_f9 = jessilib::object::has<signed_char>((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_f8,&local_f9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(local_108);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_1.message_,local_f8,"obj .has< signed_char_t >()",
               "false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_1.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x290,pcVar2);
    testing::internal::AssertHelper::operator=(local_110,local_108);
    testing::internal::AssertHelper::~AssertHelper(local_110);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  local_141 = jessilib::object::get<signed_char,_nullptr>((object *)local_58,'\0');
  local_142 = '\0';
  testing::internal::EqHelper::Compare<signed_char,_signed_char,_nullptr>
            ((EqHelper *)local_140,"obj .get< signed_char_t >()","signed_char_t {}",&local_141,
             &local_142);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(local_150);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              (local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x290,pcVar2);
    testing::internal::AssertHelper::operator=(local_158,local_150);
    testing::internal::AssertHelper::~AssertHelper(local_158);
    testing::Message::~Message(local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._7_1_ = 0;
  jessilib::object::operator=<unsigned_char,_nullptr>
            ((object *)local_58,
             (uchar *)((long)&gtest_ar__2.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      + 7));
  local_171 = jessilib::object::has<unsigned_char>((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_170,&local_171,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(local_180);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_2.message_,local_170,"obj .has< unsigned_char_t >()",
               "false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_2.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x291,pcVar2);
    testing::internal::AssertHelper::operator=(local_188,local_180);
    testing::internal::AssertHelper::~AssertHelper(local_188);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  local_1b9 = jessilib::object::get<unsigned_char,_nullptr>((object *)local_58,'\0');
  local_1ba = '\0';
  testing::internal::EqHelper::Compare<unsigned_char,_unsigned_char,_nullptr>
            ((EqHelper *)local_1b8,"obj .get< unsigned_char_t >()","unsigned_char_t {}",&local_1b9,
             &local_1ba);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(local_1c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              (local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x291,pcVar2);
    testing::internal::AssertHelper::operator=(local_1d0,local_1c8);
    testing::internal::AssertHelper::~AssertHelper(local_1d0);
    testing::Message::~Message(local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._6_2_ = 0;
  jessilib::object::operator=<short,_nullptr>
            ((object *)local_58,
             (short *)((long)&gtest_ar__3.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      + 6));
  local_1e9 = jessilib::object::has<short>((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1e8,&local_1e9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar1) {
    testing::Message::Message(local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_3.message_,local_1e8,"obj .has< short >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_3.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x292,pcVar2);
    testing::internal::AssertHelper::operator=(local_200,local_1f8);
    testing::internal::AssertHelper::~AssertHelper(local_200);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  local_232 = jessilib::object::get<short,_nullptr>((object *)local_58,0);
  local_234 = 0;
  testing::internal::EqHelper::Compare<short,_short,_nullptr>
            ((EqHelper *)local_230,"obj .get< short >()","short {}",&local_232,&local_234);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    testing::Message::Message(local_240);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_230);
    testing::internal::AssertHelper::AssertHelper
              (local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x292,pcVar2);
    testing::internal::AssertHelper::operator=(local_248,local_240);
    testing::internal::AssertHelper::~AssertHelper(local_248);
    testing::Message::~Message(local_240);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0;
  jessilib::object::operator=<int,_nullptr>
            ((object *)local_58,
             (int *)((long)&gtest_ar__4.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 4));
  local_261 = jessilib::object::has<int>((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_260,&local_261,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar1) {
    testing::Message::Message(local_270);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_4.message_,local_260,"obj .has< int >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_4.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x293,pcVar2);
    testing::internal::AssertHelper::operator=(local_278,local_270);
    testing::internal::AssertHelper::~AssertHelper(local_278);
    std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
    testing::Message::~Message(local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  local_2ac = jessilib::object::get<int,_nullptr>((object *)local_58,0);
  local_2b0 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_2a8,"obj .get< int >()","int {}",&local_2ac,&local_2b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
  if (!bVar1) {
    testing::Message::Message(local_2b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
    testing::internal::AssertHelper::AssertHelper
              (local_2c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x293,pcVar2);
    testing::internal::AssertHelper::operator=(local_2c0,local_2b8);
    testing::internal::AssertHelper::~AssertHelper(local_2c0);
    testing::Message::~Message(local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
  gtest_ar__5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  jessilib::object::operator=<long,_nullptr>((object *)local_58,(long *)&gtest_ar__5.message_);
  local_2d9 = jessilib::object::has<long>((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2d8,&local_2d9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
  if (!bVar1) {
    testing::Message::Message(local_2e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_5.message_,local_2d8,"obj .has< long >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_5.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x294,pcVar2);
    testing::internal::AssertHelper::operator=(local_2f0,local_2e8);
    testing::internal::AssertHelper::~AssertHelper(local_2f0);
    std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
    testing::Message::~Message(local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
  local_328 = jessilib::object::get<long,_nullptr>((object *)local_58,0);
  local_330 = 0;
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_320,"obj .get< long >()","long {}",&local_328,&local_330);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
  if (!bVar1) {
    testing::Message::Message(local_338);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_320);
    testing::internal::AssertHelper::AssertHelper
              (local_340,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x294,pcVar2);
    testing::internal::AssertHelper::operator=(local_340,local_338);
    testing::internal::AssertHelper::~AssertHelper(local_340);
    testing::Message::~Message(local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
  gtest_ar__6.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  jessilib::object::operator=<long_long,_nullptr>
            ((object *)local_58,(longlong *)&gtest_ar__6.message_);
  local_359 = jessilib::object::has<long_long>((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_358,&local_359,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
  if (!bVar1) {
    testing::Message::Message(local_368);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_6.message_,local_358,"obj .has< long_long_t >()","false"
              );
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_6.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_370,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x295,pcVar2);
    testing::internal::AssertHelper::operator=(local_370,local_368);
    testing::internal::AssertHelper::~AssertHelper(local_370);
    std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
    testing::Message::~Message(local_368);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
  lhs = jessilib::object::get<long_long,_nullptr>((object *)local_58,0);
  testing::internal::EqHelper::Compare
            ((EqHelper *)local_3a0,"obj .get< long_long_t >()","long_long_t {}",lhs,0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a0);
  if (!bVar1) {
    testing::Message::Message(local_3a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3a0);
    testing::internal::AssertHelper::AssertHelper
              (local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x295,pcVar2);
    testing::internal::AssertHelper::operator=(local_3b0,local_3a8);
    testing::internal::AssertHelper::~AssertHelper(local_3b0);
    testing::Message::~Message(local_3a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
  gtest_ar__7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  jessilib::object::operator=<long,_nullptr>((object *)local_58,(long *)&gtest_ar__7.message_);
  local_3c9 = jessilib::object::has<long>((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3c8,&local_3c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
  if (!bVar1) {
    testing::Message::Message(local_3d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_7.message_,local_3c8,"obj .has< intmax_t >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_7.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_3e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x296,pcVar2);
    testing::internal::AssertHelper::operator=(local_3e0,local_3d8);
    testing::internal::AssertHelper::~AssertHelper(local_3e0);
    std::__cxx11::string::~string((string *)&gtest_ar_7.message_);
    testing::Message::~Message(local_3d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
  local_418 = jessilib::object::get<long,_nullptr>((object *)local_58,0);
  local_420 = 0;
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_410,"obj .get< intmax_t >()","intmax_t {}",&local_418,&local_420);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
  if (!bVar1) {
    testing::Message::Message(local_428);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_410);
    testing::internal::AssertHelper::AssertHelper
              (local_430,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x296,pcVar2);
    testing::internal::AssertHelper::operator=(local_430,local_428);
    testing::internal::AssertHelper::~AssertHelper(local_430);
    testing::Message::~Message(local_428);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
  gtest_ar__8.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0;
  jessilib::object::operator=<float,_nullptr>
            ((object *)local_58,
             (float *)((long)&gtest_ar__8.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      + 4));
  local_449 = jessilib::object::has<float>((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_448,&local_449,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
  if (!bVar1) {
    testing::Message::Message(local_458);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_8.message_,local_448,"obj .has< float >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_8.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_460,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x297,pcVar2);
    testing::internal::AssertHelper::operator=(local_460,local_458);
    testing::internal::AssertHelper::~AssertHelper(local_460);
    std::__cxx11::string::~string((string *)&gtest_ar_8.message_);
    testing::Message::~Message(local_458);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
  local_494 = jessilib::object::get<float,_nullptr>((object *)local_58,0.0);
  local_498 = 0.0;
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_490,"obj .get< float >()","float {}",&local_494,&local_498);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_490);
  if (!bVar1) {
    testing::Message::Message(local_4a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_490);
    testing::internal::AssertHelper::AssertHelper
              (local_4a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x297,pcVar2);
    testing::internal::AssertHelper::operator=(local_4a8,local_4a0);
    testing::internal::AssertHelper::~AssertHelper(local_4a8);
    testing::Message::~Message(local_4a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
  gtest_ar__9.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  jessilib::object::operator=<double,_nullptr>((object *)local_58,(double *)&gtest_ar__9.message_);
  local_4c1 = jessilib::object::has<double>((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4c0,&local_4c1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c0);
  if (!bVar1) {
    testing::Message::Message(local_4d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_9.message_,local_4c0,"obj .has< double >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_9.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_4d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x298,pcVar2);
    testing::internal::AssertHelper::operator=(local_4d8,local_4d0);
    testing::internal::AssertHelper::~AssertHelper(local_4d8);
    std::__cxx11::string::~string((string *)&gtest_ar_9.message_);
    testing::Message::~Message(local_4d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
  local_510 = jessilib::object::get<double,_nullptr>((object *)local_58,0.0);
  local_518 = 0.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_508,"obj .get< double >()","double {}",&local_510,&local_518);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_508);
  if (!bVar1) {
    testing::Message::Message(local_520);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_508);
    testing::internal::AssertHelper::AssertHelper
              (local_528,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x298,pcVar2);
    testing::internal::AssertHelper::operator=(local_528,local_520);
    testing::internal::AssertHelper::~AssertHelper(local_528);
    testing::Message::~Message(local_520);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_508);
  unique0x00076c00 = (longdouble)0;
  jessilib::object::operator=<long_double,_nullptr>
            ((object *)local_58,(longdouble *)&gtest_ar__10.message_);
  local_549 = (Message)jessilib::object::has<long_double>((object *)local_58);
  this_00 = &local_549;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_548,(bool *)this_00,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_548);
  if (!bVar1) {
    testing::Message::Message(local_558);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_10.message_,local_548,"obj .has< long_double_t >()",
               "false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_10.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_560,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x299,pcVar2);
    this_00 = local_558;
    testing::internal::AssertHelper::operator=(local_560,this_00);
    testing::internal::AssertHelper::~AssertHelper(local_560);
    std::__cxx11::string::~string((string *)&gtest_ar_10.message_);
    testing::Message::~Message(local_558);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_548);
  jessilib::object::get<long_double,_nullptr>
            ((longdouble *)local_58,(object *)this_00,(longdouble)0);
  local_5b8 = (longdouble)0;
  testing::internal::EqHelper::Compare<long_double,_long_double,_nullptr>
            ((EqHelper *)local_590,"obj .get< long_double_t >()","long_double_t {}",&local_5a8,
             &local_5b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_590);
  if (!bVar1) {
    testing::Message::Message(local_5c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_590);
    testing::internal::AssertHelper::AssertHelper
              (local_5c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x299,pcVar2);
    testing::internal::AssertHelper::operator=(local_5c8,local_5c0);
    testing::internal::AssertHelper::~AssertHelper(local_5c8);
    testing::Message::~Message(local_5c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_590);
  std::__cxx11::u8string::u8string((u8string *)&gtest_ar__11.message_);
  jessilib::object::
  operator=<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
            ((object *)local_58,
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
             &gtest_ar__11.message_);
  std::__cxx11::u8string::~u8string((u8string *)&gtest_ar__11.message_);
  local_5f9 = jessilib::object::has<std::__cxx11::u8string>((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5f8,&local_5f9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f8);
  if (!bVar1) {
    testing::Message::Message(local_608);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_11.message_,local_5f8,"obj .has< std::u8string >()",
               "false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_11.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_610,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x29a,pcVar2);
    testing::internal::AssertHelper::operator=(local_610,local_608);
    testing::internal::AssertHelper::~AssertHelper(local_610);
    std::__cxx11::string::~string((string *)&gtest_ar_11.message_);
    testing::Message::~Message(local_608);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f8);
  std::__cxx11::u8string::u8string((u8string *)&local_680);
  jessilib::object::
  get<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
            (&local_660,(object *)local_58,&local_680);
  std::__cxx11::u8string::u8string((u8string *)&local_6a0);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
            ((EqHelper *)local_640,"obj .get< std::u8string >()","std::u8string {}",&local_660,
             &local_6a0);
  std::__cxx11::u8string::~u8string((u8string *)&local_6a0);
  std::__cxx11::u8string::~u8string((u8string *)&local_660);
  std::__cxx11::u8string::~u8string((u8string *)&local_680);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_640);
  if (!bVar1) {
    testing::Message::Message(local_6a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_640);
    testing::internal::AssertHelper::AssertHelper
              (local_6b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x29a,pcVar2);
    testing::internal::AssertHelper::operator=(local_6b0,local_6a8);
    testing::internal::AssertHelper::~AssertHelper(local_6b0);
    testing::Message::~Message(local_6a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_640);
  gtest_ar__12.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::vector<jessilib::object,_std::allocator<jessilib::object>_>::vector
            ((vector<jessilib::object,_std::allocator<jessilib::object>_> *)&gtest_ar__12.message_);
  jessilib::object::
  operator=<std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_nullptr>
            ((object *)local_58,
             (vector<jessilib::object,_std::allocator<jessilib::object>_> *)&gtest_ar__12.message_);
  std::vector<jessilib::object,_std::allocator<jessilib::object>_>::~vector
            ((vector<jessilib::object,_std::allocator<jessilib::object>_> *)&gtest_ar__12.message_);
  local_6d9 = jessilib::object::has<std::vector<jessilib::object,std::allocator<jessilib::object>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6d8,&local_6d9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6d8);
  if (!bVar1) {
    testing::Message::Message(local_6e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_12.message_,local_6d8,"obj .has< object::array_type >()"
               ,"false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_12.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_6f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x29b,pcVar2);
    testing::internal::AssertHelper::operator=(local_6f0,local_6e8);
    testing::internal::AssertHelper::~AssertHelper(local_6f0);
    std::__cxx11::string::~string((string *)&gtest_ar_12.message_);
    testing::Message::~Message(local_6e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6d8);
  local_758.super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_758.super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_758.super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<jessilib::object,_std::allocator<jessilib::object>_>::vector(&local_758);
  jessilib::object::get<std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_nullptr>
            (&local_738,(object *)local_58,&local_758);
  local_778.super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_778.super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_778.super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<jessilib::object,_std::allocator<jessilib::object>_>::vector(&local_778);
  testing::internal::EqHelper::
  Compare<std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_nullptr>
            ((EqHelper *)local_720,"obj .get< object::array_type >()","object::array_type {}",
             &local_738,&local_778);
  std::vector<jessilib::object,_std::allocator<jessilib::object>_>::~vector(&local_778);
  std::vector<jessilib::object,_std::allocator<jessilib::object>_>::~vector(&local_738);
  std::vector<jessilib::object,_std::allocator<jessilib::object>_>::~vector(&local_758);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_720);
  if (!bVar1) {
    testing::Message::Message(local_780);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_720);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x29b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__13.message_,local_780);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__13.message_);
    testing::Message::~Message(local_780);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_720);
  jessilib::object::operator=<const_char8_t_(&)[1],_nullptr>
            ((object *)local_58,(char8_t (*) [1])0x6ac6d0);
  local_799 = jessilib::object::has<std::__cxx11::u8string>((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_798,&local_799,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_798);
  if (!bVar1) {
    testing::Message::Message(local_7a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_13.message_,local_798,"obj.has<std::u8string>()","false"
              );
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_13.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_7b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x29f,pcVar2);
    testing::internal::AssertHelper::operator=(local_7b0,local_7a8);
    testing::internal::AssertHelper::~AssertHelper(local_7b0);
    std::__cxx11::string::~string((string *)&gtest_ar_13.message_);
    testing::Message::~Message(local_7a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_798);
  std::__cxx11::u8string::u8string((u8string *)&local_820);
  jessilib::object::
  get<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
            (&local_800,(object *)local_58,&local_820);
  std::__cxx11::u8string::u8string((u8string *)&local_840);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
            ((EqHelper *)local_7e0,"obj.get<std::u8string>()","std::u8string{}",&local_800,
             &local_840);
  std::__cxx11::u8string::~u8string((u8string *)&local_840);
  std::__cxx11::u8string::~u8string((u8string *)&local_800);
  std::__cxx11::u8string::~u8string((u8string *)&local_820);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7e0);
  if (!bVar1) {
    testing::Message::Message(local_848);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7e0);
    testing::internal::AssertHelper::AssertHelper
              (local_850,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x2a0,pcVar2);
    testing::internal::AssertHelper::operator=(local_850,local_848);
    testing::internal::AssertHelper::~AssertHelper(local_850);
    testing::Message::~Message(local_848);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7e0);
  join_0x00000010_0x00000000_ = sv("",0);
  jessilib::object::operator=<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_nullptr>
            ((object *)local_58,
             (basic_string_view<char8_t,_std::char_traits<char8_t>_> *)&gtest_ar__14.message_);
  local_871 = jessilib::object::has<std::__cxx11::u8string>((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_870,&local_871,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_870);
  if (!bVar1) {
    testing::Message::Message(local_880);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_14.message_,local_870,"obj.has<std::u8string>()","false"
              );
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_14.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_888,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x2a4,pcVar2);
    testing::internal::AssertHelper::operator=(local_888,local_880);
    testing::internal::AssertHelper::~AssertHelper(local_888);
    std::__cxx11::string::~string((string *)&gtest_ar_14.message_);
    testing::Message::~Message(local_880);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_870);
  std::__cxx11::u8string::u8string((u8string *)&local_8f8);
  jessilib::object::
  get<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
            (&local_8d8,(object *)local_58,&local_8f8);
  std::__cxx11::u8string::u8string((u8string *)&local_918);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
            ((EqHelper *)local_8b8,"obj.get<std::u8string>()","std::u8string{}",&local_8d8,
             &local_918);
  std::__cxx11::u8string::~u8string((u8string *)&local_918);
  std::__cxx11::u8string::~u8string((u8string *)&local_8d8);
  std::__cxx11::u8string::~u8string((u8string *)&local_8f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8b8);
  if (!bVar1) {
    testing::Message::Message(local_920);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8b8);
    testing::internal::AssertHelper::AssertHelper
              (local_928,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x2a5,pcVar2);
    testing::internal::AssertHelper::operator=(local_928,local_920);
    testing::internal::AssertHelper::~AssertHelper(local_928);
    testing::Message::~Message(local_920);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8b8);
  jessilib::object::~object((object *)local_58);
  return;
}

Assistant:

TEST(ObjectTest, basic_assignment_operator) {
	object obj;

	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, bool);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, signed_char_t);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, unsigned_char_t);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, short);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, int);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, long);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, long_long_t);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, intmax_t);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, float);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, double);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, long_double_t);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::u8string);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, object::array_type);

	// const char*
	obj = u8"";
	EXPECT_TRUE(obj.has<std::u8string>());
	EXPECT_EQ(obj.get<std::u8string>(), std::u8string{});

	// std::u8string_view
	obj = u8""sv;
	EXPECT_TRUE(obj.has<std::u8string>());
	EXPECT_EQ(obj.get<std::u8string>(), std::u8string{});
}